

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_guarded.hpp
# Opt level: O0

atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
* __thiscall
gmlc::libguarded::atomic_guarded<std::__cxx11::string,std::mutex>::operator=
          (atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
           *this,basic_string_view<char,_std::char_traits<char>_> *newObj)

{
  atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
  *in_RDI;
  lock_guard<std::mutex> glock;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc8;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,(mutex_type *)in_stack_ffffffffffffffc8);
  std::__cxx11::string::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
             in_stack_ffffffffffffffc8);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2df091);
  return in_RDI;
}

Assistant:

atomic_guarded& operator=(objType&& newObj)
    {  // uses a forwarding reference
        std::lock_guard<M> glock(m_mutex);
        m_obj = std::forward<objType>(newObj);
        return *this;
    }